

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O2

MPP_RET mpp_service_attach_fd(void *ctx,MppDevBufMapNode *node)

{
  RK_S32 fd;
  uint __errnum;
  list_head *plVar1;
  list_head *plVar2;
  MPP_RET MVar3;
  RK_U32 RVar4;
  uint *puVar5;
  char *pcVar6;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 uVar7;
  undefined4 uVar8;
  RK_U32 local_3c;
  MppReqV1 local_38;
  
  uVar8 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (node->buffer == (MppBuffer)0x0) {
    uVar7 = CONCAT44(uVar8,0x2a1);
    _mpp_log_l(2,"mpp_serivce","Assertion %s failed at %s:%d\n",(char *)0x0,"node->buffer",
               "mpp_service_attach_fd",uVar7);
    uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00172cc4;
  }
  if (node->lock_buf == (pthread_mutex_t *)0x0) {
    uVar7 = CONCAT44(uVar8,0x2a2);
    _mpp_log_l(2,"mpp_serivce","Assertion %s failed at %s:%d\n",(char *)0x0,"node->lock_buf",
               "mpp_service_attach_fd",uVar7);
    uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00172cc4;
  }
  local_3c = node->buf_fd;
  if ((int)local_3c < 0) {
    uVar7 = CONCAT44(uVar8,0x2a3);
    _mpp_log_l(2,"mpp_serivce","Assertion %s failed at %s:%d\n",(char *)0x0,"node->buf_fd >= 0",
               "mpp_service_attach_fd",uVar7);
    uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00172cc4:
      abort();
    }
    local_3c = node->buf_fd;
  }
  node->lock_dev = (pthread_mutex_t *)((long)ctx + 0x198);
  fd = *(RK_S32 *)((long)ctx + 4);
  node->dev_fd = fd;
  local_38.data_ptr = (RK_U64)&local_3c;
  local_38.cmd = 0x401;
  local_38.flag = 2;
  local_38.size = 4;
  local_38.offset = 0;
  MVar3 = mpp_service_ioctl_request(fd,&local_38);
  if (MVar3 == MPP_OK) {
    node->iova = local_3c;
    plVar1 = *(list_head **)((long)ctx + 0x1c8);
    *(list_head **)((long)ctx + 0x1c8) = &node->list_dev;
    (node->list_dev).next = (list_head *)((long)ctx + 0x1c0);
    (node->list_dev).prev = plVar1;
    plVar1->next = &node->list_dev;
    RVar4 = local_3c;
  }
  else {
    puVar5 = (uint *)__errno_location();
    __errnum = *puVar5;
    pcVar6 = strerror(__errnum);
    _mpp_log_l(2,"mpp_serivce","failed ret %d errno %d %s\n","mpp_service_ioc_attach_fd",
               (ulong)(uint)MVar3,(ulong)__errnum,pcVar6);
    uVar8 = (undefined4)((ulong)pcVar6 >> 0x20);
    node->iova = 0xffffffff;
    node->lock_dev = (pthread_mutex_t *)0x0;
    node->dev_fd = -1;
    plVar1 = (node->list_dev).next;
    plVar2 = (node->list_dev).prev;
    plVar1->prev = plVar2;
    plVar2->next = plVar1;
    (node->list_dev).next = &node->list_dev;
    (node->list_dev).prev = &node->list_dev;
    RVar4 = 0xffffffff;
  }
  if (((byte)mpp_device_debug & 0x80) != 0) {
    _mpp_log_l(4,"mpp_serivce","node %p dev %d attach fd %d iova %x\n",(char *)0x0,node,
               (ulong)(uint)node->dev_fd,CONCAT44(uVar8,node->buf_fd),RVar4);
  }
  return MVar3;
}

Assistant:

MPP_RET mpp_service_attach_fd(void *ctx, MppDevBufMapNode *node)
{
    MppDevMppService *p = (MppDevMppService *)ctx;
    MPP_RET ret;

    mpp_assert(node->buffer);
    mpp_assert(node->lock_buf);
    mpp_assert(node->buf_fd >= 0);

    node->lock_dev = &p->lock_bufs;
    node->dev_fd = p->client;
    ret = mpp_service_ioc_attach_fd(node);
    if (ret) {
        node->lock_dev = NULL;
        node->dev_fd = -1;
        list_del_init(&node->list_dev);
    } else {
        list_add_tail(&node->list_dev, &p->list_bufs);
    }

    mpp_dev_dbg_buf("node %p dev %d attach fd %d iova %x\n",
                    node, node->dev_fd, node->buf_fd, node->iova);

    return ret;
}